

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

ACT_TYPE __thiscall
despot::TagSHRPolicy::Action
          (TagSHRPolicy *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  value_type_conflict1 vVar1;
  byte bVar2;
  int iVar3;
  ACT_TYPE AVar4;
  size_t sVar5;
  OBS_TYPE OVar6;
  size_type sVar7;
  undefined8 uVar8;
  reference pvVar9;
  ACT_TYPE action;
  value_type_conflict1 local_7c;
  undefined8 uStack_78;
  int d_1;
  value_type_conflict1 local_70;
  undefined8 uStack_6c;
  int d;
  undefined8 local_64;
  undefined8 local_50;
  Coord rob;
  vector<int,_std::allocator<int>_> actions;
  History *history_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  TagSHRPolicy *this_local;
  
  sVar5 = History::Size(history);
  if (sVar5 == 0) {
    (**(code **)(*(long *)this->tag_model_ + 0x18))();
    this_local._4_4_ = despot::Random::NextInt(0x15a198);
  }
  else {
    OVar6 = History::LastObservation(history);
    if (OVar6 == this->tag_model_->same_loc_obs_) {
      this_local._4_4_ = BaseTag::TagAction(this->tag_model_);
    }
    else {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&rob);
      despot::Coord::Coord((Coord *)&local_50);
      OVar6 = this->tag_model_->same_loc_obs_;
      iVar3 = despot::Floor::NumCells();
      if (OVar6 == (long)iVar3) {
        History::LastObservation(history);
        uStack_6c = despot::Floor::GetCell((int)this + 0x28);
        local_50 = uStack_6c;
      }
      else {
        local_64 = BaseTag::MostLikelyRobPosition(this->tag_model_,particles);
        local_50 = local_64;
      }
      for (local_70 = 0; vVar1 = local_70, local_70 < 4; local_70 = local_70 + 1) {
        AVar4 = History::LastAction(history);
        bVar2 = despot::Compass::Opposite(vVar1,AVar4);
        if ((bVar2 & 1) == 0) {
          uStack_78 = despot::operator+((Coord *)&local_50,
                                        (Coord *)(&Compass::DIRECTIONS + local_70));
          bVar2 = despot::Floor::Inside(&this->floor_,uStack_78);
          if ((bVar2 & 1) != 0) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&rob,&local_70);
          }
        }
      }
      sVar7 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&rob);
      if (sVar7 == 0) {
        for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
          uVar8 = despot::operator+((Coord *)&local_50,(Coord *)(&Compass::DIRECTIONS + local_7c));
          bVar2 = despot::Floor::Inside(&this->floor_,uVar8);
          if ((bVar2 & 1) != 0) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&rob,&local_7c);
          }
        }
      }
      sVar7 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&rob);
      if (sVar7 == 0) {
        this_local._4_4_ = 0;
      }
      else {
        std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&rob);
        iVar3 = despot::Random::NextInt(0x15a198);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&rob,(long)iVar3);
        this_local._4_4_ = *pvVar9;
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&rob);
    }
  }
  return this_local._4_4_;
}

Assistant:

ACT_TYPE Action(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		// If history is empty then take a random move
		if (history.Size() == 0) {
			return Random::RANDOM.NextInt(tag_model_->NumActions() - 1);
		}

		// If we just saw an opponent then TAG
		if (history.LastObservation() == tag_model_->same_loc_obs_) {
			return tag_model_->TagAction();
		}

		vector<ACT_TYPE> actions;
		// Compute rob position
		Coord rob;
		if (tag_model_->same_loc_obs_ != floor_.NumCells()) {
			rob = tag_model_->MostLikelyRobPosition(particles);
		} else {
			rob = floor_.GetCell(history.LastObservation());
		}

		// Don't double back and don't go into walls
		for (int d = 0; d < 4; d++) {
			if (!Compass::Opposite(d, history.LastAction())
				&& floor_.Inside(rob + Compass::DIRECTIONS[d])) {
				actions.push_back(d);
			}
		}

		// Have to double back
		if (actions.size() == 0) {
			for (int d = 0; d < 4; d++) {
				if (floor_.Inside(rob + Compass::DIRECTIONS[d]))
					actions.push_back(d);
			}
		}

		// Rob may be trapped by the obstacles
		if (actions.size() == 0)
			return 0;

		ACT_TYPE action = actions[Random::RANDOM.NextInt(actions.size())];
		return action;
	}